

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O2

int coda_cursor_read_complex_double_split_array
              (coda_cursor_conflict *cursor,double *dst_re,double *dst_im,
              coda_array_ordering array_ordering)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  coda_type *pcVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  int num_dims;
  ulong local_400;
  uint8_t buffer [16];
  long alStack_3e8 [12];
  long dim [8];
  coda_cursor_conflict array_cursor;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (pcVar4 = (coda_type *)cursor->stack[cursor->n - 1].type, pcVar4 == (coda_type *)0x0)) {
    pcVar6 = "invalid cursor argument (%s:%u)";
    uVar8 = 0x1651;
  }
  else if (dst_re == (double *)0x0) {
    pcVar6 = "dst_re argument is NULL (%s:%u)";
    uVar8 = 0x1656;
  }
  else {
    if (dst_im != (double *)0x0) {
      if (99 < pcVar4->format) {
        pcVar4 = *(coda_type **)&pcVar4->type_class;
      }
      if (pcVar4->type_class != coda_array_class) {
        pcVar6 = coda_type_get_class_name(pcVar4->type_class);
        coda_set_error(-0x69,"cursor does not refer to an array (current type is %s)",pcVar6);
        return -1;
      }
      iVar2 = coda_cursor_get_array_dim(cursor,&num_dims,dim);
      if (iVar2 != 0) {
        return -1;
      }
      memcpy(&array_cursor,cursor,0x310);
      lVar5 = (long)num_dims;
      if (array_ordering == coda_array_ordering_fortran && 1 < lVar5) {
        alStack_3e8[2] = 1;
        lVar9 = 1;
        for (lVar11 = 0; lVar5 != lVar11; lVar11 = lVar11 + 1) {
          lVar9 = lVar9 * dim[lVar11];
          alStack_3e8[lVar11 + 3] = lVar9;
        }
        local_400 = alStack_3e8[lVar5 + 2];
        if (0 < (long)local_400) {
          alStack_3e8[1] = alStack_3e8[lVar5 + 1];
          iVar2 = coda_cursor_goto_array_element_by_index(&array_cursor,0);
          if (iVar2 != 0) {
            return -1;
          }
          lVar9 = 0;
          lVar5 = 0;
          while( true ) {
            do {
              read_double_pair(&array_cursor,(double *)buffer);
              dst_re[lVar5] = (double)buffer._0_8_;
              dst_im[lVar5] = (double)buffer._8_8_;
              lVar9 = lVar9 + 1;
              if ((lVar9 < (long)local_400) &&
                 (iVar2 = coda_cursor_goto_next_array_element(&array_cursor), iVar2 != 0)) {
                return -1;
              }
              lVar5 = lVar5 + alStack_3e8[1];
            } while (lVar5 < (long)local_400);
            if (lVar9 == local_400) break;
            uVar3 = num_dims - 3;
            for (lVar5 = (lVar5 + alStack_3e8[num_dims]) - alStack_3e8[(long)num_dims + 2];
                (-1 < (int)uVar3 && (uVar1 = uVar3 + 2, alStack_3e8[(ulong)uVar1 + 2] <= lVar5));
                lVar5 = (lVar5 - alStack_3e8[(ulong)uVar1 + 2]) + alStack_3e8[uVar7 + 2]) {
              uVar7 = (ulong)uVar3;
              uVar3 = uVar3 - 1;
            }
          }
        }
      }
      else {
        uVar7 = 0;
        uVar10 = 0;
        if (0 < num_dims) {
          uVar10 = (ulong)(uint)num_dims;
        }
        uVar12 = 1;
        for (; uVar10 != uVar7; uVar7 = uVar7 + 1) {
          uVar12 = uVar12 * dim[uVar7];
        }
        if (0 < (long)uVar12) {
          iVar2 = coda_cursor_goto_array_element_by_index(&array_cursor,0);
          if (iVar2 != 0) {
            return -1;
          }
          local_400 = uVar12 - 1;
          for (uVar7 = 0; uVar12 != uVar7; uVar7 = uVar7 + 1) {
            read_double_pair(&array_cursor,(double *)buffer);
            dst_re[uVar7] = (double)buffer._0_8_;
            dst_im[uVar7] = (double)buffer._8_8_;
            if ((uVar7 < local_400) &&
               (iVar2 = coda_cursor_goto_next_array_element(&array_cursor), iVar2 != 0)) {
              return -1;
            }
          }
        }
      }
      return 0;
    }
    pcVar6 = "dst_im argument is NULL (%s:%u)";
    uVar8 = 0x165b;
  }
  coda_set_error(-100,pcVar6,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                 ,uVar8);
  return -1;
}

Assistant:

LIBCODA_API int coda_cursor_read_complex_double_split_array(const coda_cursor *cursor, double *dst_re, double *dst_im,
                                                            coda_array_ordering array_ordering)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_re == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_re argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (dst_im == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "dst_im argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_array_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to an array (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }
    return read_split_array(cursor, (read_function)&read_double_pair, (uint8_t *)dst_re, (uint8_t *)dst_im,
                            sizeof(double), array_ordering);
}